

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  size_type sVar1;
  char *pcVar2;
  int i;
  int iVar3;
  float grow;
  float fVar4;
  pair<google::dense_hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  size_t bucket_count;
  float shrink_threshold;
  key_type local_158;
  float local_134;
  AssertHelper local_130;
  string local_128;
  long *local_108;
  int local_100;
  float local_fc;
  HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *local_f8;
  undefined1 local_f0 [8];
  undefined1 local_e8 [128];
  size_type local_68;
  size_type local_60;
  long *local_58;
  
  local_134 = 0.2;
  local_f8 = (HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              *)this;
  do {
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length._0_4_ = 0;
    local_108 = (long *)0x0;
    local_100 = 0;
    local_158._M_dataplus._M_p._0_4_ = 0;
    local_158._M_string_length = 0;
    google::
    HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                *)local_f0,0,(hasher *)&local_128,(key_equal *)&local_108,
               (allocator_type *)&local_158);
    HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(&local_158,local_f8,1);
    google::
    dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::squash_deleted((dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                      *)local_e8);
    local_e8[0x2a] = true;
    std::__cxx11::string::_M_assign((string *)(local_e8 + 0x40));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_158._M_dataplus._M_p._4_4_,local_158._M_dataplus._M_p._0_4_) !=
        &local_158.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_158._M_dataplus._M_p._4_4_,local_158._M_dataplus._M_p._0_4_));
    }
    local_e8._36_4_ = local_134 * 0.5;
    local_e8._32_4_ = local_134;
    fVar4 = local_134 * (float)local_58;
    local_e8._16_8_ = (undefined8)fVar4;
    local_e8._16_8_ = (long)(fVar4 - 9.223372e+18) & (long)local_e8._16_8_ >> 0x3f | local_e8._16_8_
    ;
    if (0.0 <= (float)local_e8._36_4_) {
      local_e8._36_4_ = 0.0;
    }
    fVar4 = (float)local_e8._36_4_ * (float)local_58;
    local_e8._24_8_ = (undefined8)fVar4;
    local_e8._24_8_ = (long)(fVar4 - 9.223372e+18) & (long)local_e8._24_8_ >> 0x3f | local_e8._24_8_
    ;
    local_e8[0x28] = false;
    local_128._M_dataplus._M_p._0_4_ = local_134;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_158,"grow_threshold","ht.max_load_factor()",&local_134,
               (float *)&local_128);
    if ((char)local_158._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_128);
      pcVar2 = "";
      if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_158._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x269,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_158._M_string_length;
    if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_158._M_string_length !=
          (undefined8 *)(local_158._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_158._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_108 = (long *)CONCAT44(local_108._4_4_,local_e8._36_4_);
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_158,"0.0","ht.min_load_factor()",(double *)&local_128,
               (float *)&local_108);
    if ((char)local_158._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_128);
      pcVar2 = "";
      if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_158._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x26a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_158._M_string_length;
    if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_158._M_string_length !=
          (undefined8 *)(local_158._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_158._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    google::
    dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::resize((dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
              *)local_e8,0x4098);
    local_108 = local_58;
    UniqueObjectHelper<std::__cxx11::string>(&local_128,2);
    google::
    dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
    ::insert<std::__cxx11::string_const&>
              ((pair<google::dense_hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)&local_158,
               (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                *)local_e8,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(&local_158,local_f8,2);
    google::
    dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::erase((dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
             *)local_e8,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_158._M_dataplus._M_p._4_4_,local_158._M_dataplus._M_p._0_4_) !=
        &local_158.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_158._M_dataplus._M_p._4_4_,local_158._M_dataplus._M_p._0_4_));
    }
    iVar3 = 2;
    while( true ) {
      UniqueObjectHelper<std::__cxx11::string>(&local_128,iVar3);
      google::
      dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
      ::insert<std::__cxx11::string_const&>
                ((pair<google::dense_hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>,_bool>
                  *)&local_158,
                 (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                  *)local_e8,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if (local_134 <= (float)(local_60 - local_68) / (float)local_108) break;
      local_128._M_dataplus._M_p = (pointer)local_58;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_158,"bucket_count","ht.bucket_count()",
                 (unsigned_long *)&local_108,(unsigned_long *)&local_128);
      if ((char)local_158._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_128);
        pcVar2 = "";
        if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_158._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x275,pcVar2);
        testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
        }
      }
      sVar1 = local_158._M_string_length;
      if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_158._M_string_length !=
            (undefined8 *)(local_158._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_158._M_string_length);
        }
        operator_delete((void *)sVar1);
      }
      iVar3 = iVar3 + 1;
    }
    local_128._M_dataplus._M_p = (pointer)local_58;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((internal *)&local_158,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_128
               ,(unsigned_long *)&local_108);
    if ((char)local_158._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_128);
      pcVar2 = "";
      if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_158._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x277,pcVar2);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_158._M_string_length;
    if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_158._M_string_length !=
          (undefined8 *)(local_158._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_158._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    fVar4 = (float)local_58;
    local_fc = (float)(local_60 - local_68) / fVar4 + -0.01;
    local_e8._36_4_ = 0.5;
    if (local_fc <= 0.5) {
      local_e8._36_4_ = local_fc;
    }
    local_e8._32_4_ = 1.0;
    local_e8._16_8_ = (long)(fVar4 - 9.223372e+18) & (long)fVar4 >> 0x3f | (long)fVar4;
    local_e8._24_8_ = (undefined8)((float)local_e8._36_4_ * fVar4);
    local_e8._24_8_ =
         (long)((float)local_e8._36_4_ * fVar4 - 9.223372e+18) & (long)local_e8._24_8_ >> 0x3f |
         local_e8._24_8_;
    local_e8[0x28] = false;
    local_128._M_dataplus._M_p = &DAT_3ff0000000000000;
    local_130.data_._0_4_ = 0x3f800000;
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_158,"1.0","ht.max_load_factor()",(double *)&local_128,
               (float *)&local_130);
    if ((char)local_158._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_128);
      pcVar2 = "";
      if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_158._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x282,pcVar2);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_158._M_string_length;
    if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_158._M_string_length !=
          (undefined8 *)(local_158._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_158._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    local_128._M_dataplus._M_p._0_4_ = (float)local_e8._36_4_;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_158,"shrink_threshold","ht.min_load_factor()",&local_fc,
               (float *)&local_128);
    if ((char)local_158._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_128);
      pcVar2 = "";
      if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_158._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x283,pcVar2);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_158._M_string_length;
    if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_158._M_string_length !=
          (undefined8 *)(local_158._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_158._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    local_108 = local_58;
    iVar3 = 3;
    while( true ) {
      HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueKey(&local_158,local_f8,iVar3 + -1);
      google::
      dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
      ::erase((dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
               *)local_e8,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_158._M_dataplus._M_p._4_4_,local_158._M_dataplus._M_p._0_4_) !=
          &local_158.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_158._M_dataplus._M_p._4_4_,local_158._M_dataplus._M_p._0_4_))
        ;
      }
      HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueKey(&local_158,local_f8,iVar3);
      google::
      dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
      ::erase((dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
               *)local_e8,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_158._M_dataplus._M_p._4_4_,local_158._M_dataplus._M_p._0_4_) !=
          &local_158.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_158._M_dataplus._M_p._4_4_,local_158._M_dataplus._M_p._0_4_))
        ;
      }
      UniqueObjectHelper<std::__cxx11::string>(&local_128,iVar3);
      google::
      dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
      ::insert<std::__cxx11::string_const&>
                ((pair<google::dense_hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>,_bool>
                  *)&local_158,
                 (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                  *)local_e8,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((float)(local_60 - local_68) / (float)local_108 <= local_fc) break;
      local_128._M_dataplus._M_p = (pointer)local_58;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_158,"bucket_count","ht.bucket_count()",
                 (unsigned_long *)&local_108,(unsigned_long *)&local_128);
      if ((char)local_158._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_128);
        pcVar2 = "";
        if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_158._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x28e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
        }
      }
      sVar1 = local_158._M_string_length;
      if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_158._M_string_length !=
            (undefined8 *)(local_158._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_158._M_string_length);
        }
        operator_delete((void *)sVar1);
      }
      iVar3 = iVar3 + 1;
    }
    local_128._M_dataplus._M_p = (pointer)local_58;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_158,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_128
               ,(unsigned_long *)&local_108);
    if ((char)local_158._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_128);
      pcVar2 = "";
      if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_158._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x290,pcVar2);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_158._M_string_length;
    if ((undefined8 *)local_158._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_158._M_string_length !=
          (undefined8 *)(local_158._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_158._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    local_f0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c18b08;
    google::
    dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::~dense_hashtable((dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                        *)local_e8);
    local_134 = local_134 + 0.2;
  } while (local_134 <= 0.8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}